

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::SetupFeatureResolution
          (CommandLineInterface *this,DescriptorPool *pool)

{
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1 aVar1;
  int iVar2;
  ulong uVar3;
  LogMessage *pLVar4;
  Descriptor *this_00;
  FeatureSetDefaults *from;
  MaybeInitializedPtr v;
  long *plVar5;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1 aVar6;
  bool bVar7;
  string_view v_00;
  Span<const_google::protobuf::FieldDescriptor_*const> extensions;
  Status status;
  StatusOr<google::protobuf::FeatureSetDefaults> defaults;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  feature_extensions;
  __atomic_base<long> in_stack_ffffffffffffff08;
  LogMessage local_f0;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1 local_e0;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1 local_d8;
  DescriptorPool *local_a0;
  HeapOrSoo local_98;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_88;
  FeatureSetDefaults local_68;
  
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v = (MaybeInitializedPtr)
      (this->output_directives_).
      super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
      ._M_impl.super__Vector_impl_data._M_start;
  local_98.heap.slot_array =
       (MaybeInitializedPtr)
       (this->output_directives_).
       super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_a0 = pool;
  local_98.heap.control = (ctrl_t *)this;
  do {
    if ((MaybeInitializedPtr)v.p == local_98.heap.slot_array) {
      this_00 = FeatureSet::GetDescriptor();
      extensions.ptr_ =
           (pointer)((long)local_88._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_88._M_impl.super__Vector_impl_data._M_start >> 3);
      extensions.len_ = 0x3e6;
      FeatureResolver::CompileDefaults
                ((StatusOr<google::protobuf::FeatureSetDefaults> *)&local_e0.status_,
                 (FeatureResolver *)this_00,
                 (Descriptor *)local_88._M_impl.super__Vector_impl_data._M_start,extensions,
                 EDITION_2024,(Edition)in_stack_ffffffffffffff08._M_i);
      bVar7 = local_e0 ==
              (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)0x1;
      if (bVar7) {
        from = absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::value
                         ((StatusOr<google::protobuf::FeatureSetDefaults> *)&local_e0.status_);
        FeatureSetDefaults::FeatureSetDefaults(&local_68,from);
        DescriptorPool::SetFeatureSetDefaults
                  ((DescriptorPool *)&stack0xffffffffffffff08,(FeatureSetDefaults *)local_a0);
        FeatureSetDefaults::~FeatureSetDefaults(&local_68);
        if (in_stack_ffffffffffffff08._M_i != 1) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                     ,0x623,"status.ok()");
          v_00 = absl::lts_20250127::Status::message((Status *)&stack0xffffffffffffff08);
          absl::lts_20250127::log_internal::LogMessage::operator<<(&local_f0,v_00);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_f0);
        }
        absl::lts_20250127::Status::~Status((Status *)&stack0xffffffffffffff08);
      }
      else {
        absl::lts_20250127::log_internal::LogMessage::LogMessage
                  (&local_f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                   ,0x61f);
        absl::lts_20250127::log_internal::LogMessage::operator<<<absl::lts_20250127::Status,_0>
                  (&local_f0,&local_e0.status_);
        absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_f0);
      }
      absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
      ~StatusOrData((StatusOrData<google::protobuf::FeatureSetDefaults> *)&local_e0.status_);
LAB_0019ab2b:
      std::
      _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~_Vector_base(&local_88);
      return bVar7;
    }
    plVar5 = (long *)(((string *)((long)v.p + 0x20))->_M_dataplus)._M_p;
    if (plVar5 != (long *)0x0) {
      if ((bool)local_98.heap.control[0x238] == false) {
        uVar3 = (**(code **)(*plVar5 + 0x20))(plVar5);
        plVar5 = (long *)(((string *)((long)v.p + 0x20))->_M_dataplus)._M_p;
        if ((uVar3 & 2) != 0) {
          iVar2 = (**(code **)(*plVar5 + 0x38))(plVar5);
          if (iVar2 == 0x3e6) {
            iVar2 = (**(code **)(*(long *)(((string *)((long)v.p + 0x20))->_M_dataplus)._M_p + 0x40)
                    )();
            if (iVar2 == 1000) {
              plVar5 = (long *)(((string *)((long)v.p + 0x20))->_M_dataplus)._M_p;
              goto LAB_0019a9f1;
            }
            absl::lts_20250127::log_internal::LogMessage::LogMessage
                      ((LogMessage *)&local_e0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                       ,0x608);
            pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                               ((LogMessage *)&local_e0.status_,(char (*) [20])"Built-in generator "
                               );
            pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,(string *)v.p);
            pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                               (pLVar4,(char (*) [30])" specifies a maximum edition ");
            local_f0.errno_saver_.saved_errno_ =
                 (**(code **)(*(long *)(((string *)((long)v.p + 0x20))->_M_dataplus)._M_p + 0x40))()
            ;
            pLVar4 = absl::lts_20250127::log_internal::LogMessage::
                     operator<<<google::protobuf::Edition,_0>(pLVar4,(Edition *)&local_f0);
            pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                               (pLVar4,(char (*) [34])" which is not the protoc maximum ");
            pLVar4 = absl::lts_20250127::log_internal::LogMessage::
                     operator<<<google::protobuf::Edition,_0>
                               (pLVar4,(Edition *)&stack0xffffffffffffff08);
            absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,(char (*) [2])0x3b285f);
          }
          else {
            absl::lts_20250127::log_internal::LogMessage::LogMessage
                      ((LogMessage *)&local_e0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                       ,0x600);
            pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                               ((LogMessage *)&local_e0.status_,(char (*) [20])"Built-in generator "
                               );
            pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,(string *)v.p);
            pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                               (pLVar4,(char (*) [30])" specifies a minimum edition ");
            local_f0.errno_saver_.saved_errno_ =
                 (**(code **)(*(long *)(((string *)((long)v.p + 0x20))->_M_dataplus)._M_p + 0x38))()
            ;
            pLVar4 = absl::lts_20250127::log_internal::LogMessage::
                     operator<<<google::protobuf::Edition,_0>(pLVar4,(Edition *)&local_f0);
            pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                               (pLVar4,(char (*) [34])" which is not the protoc minimum ");
            pLVar4 = absl::lts_20250127::log_internal::LogMessage::
                     operator<<<google::protobuf::Edition,_0>
                               (pLVar4,(Edition *)&stack0xffffffffffffff08);
            absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,(char (*) [2])0x3b285f);
          }
          absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&local_e0.status_)
          ;
LAB_0019aa93:
          bVar7 = false;
          goto LAB_0019ab2b;
        }
      }
LAB_0019a9f1:
      (**(code **)(*plVar5 + 0x30))(&local_e0);
      aVar1 = local_d8;
      for (aVar6 = local_e0; aVar6 != aVar1;
          aVar6 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)
                  ((long)aVar6 + 8)) {
        in_stack_ffffffffffffff08._M_i = *(__int_type_conflict *)aVar6;
        if ((value_type)in_stack_ffffffffffffff08._M_i == (value_type)0x0) {
          absl::lts_20250127::log_internal::LogMessage::LogMessage
                    (&local_f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                     ,0x613);
          pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             (&local_f0,(char (*) [20])"Built-in generator ");
          pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,(string *)v.p);
          absl::lts_20250127::log_internal::LogMessage::operator<<
                    (pLVar4,(char (*) [41])" specifies an unknown feature extension.");
          absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_f0);
          std::
          _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::~_Vector_base((_Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           *)&local_e0.status_);
          goto LAB_0019aa93;
        }
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)&local_88,(value_type *)&stack0xffffffffffffff08);
      }
      std::
      _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~_Vector_base((_Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)&local_e0.status_);
    }
    v.p = v.p + 0x68;
  } while( true );
}

Assistant:

bool CommandLineInterface::SetupFeatureResolution(DescriptorPool& pool) {
  // Calculate the feature defaults for each built-in generator.  All generators
  // that support editions must agree on the supported edition range.
  std::vector<const FieldDescriptor*> feature_extensions;
  for (const auto& output : output_directives_) {
    if (output.generator == nullptr) continue;
    if (!experimental_editions_ &&
        (output.generator->GetSupportedFeatures() &
         CodeGenerator::FEATURE_SUPPORTS_EDITIONS) != 0) {
      // Only validate min/max edition on generators that advertise editions
      // support.  Generators still under development will always use the
      // correct values.
      if (output.generator->GetMinimumEdition() != ProtocMinimumEdition()) {
        ABSL_LOG(ERROR) << "Built-in generator " << output.name
                        << " specifies a minimum edition "
                        << output.generator->GetMinimumEdition()
                        << " which is not the protoc minimum "
                        << ProtocMinimumEdition() << ".";
        return false;
      }
      if (output.generator->GetMaximumEdition() != ProtocMaximumEdition()) {
        ABSL_LOG(ERROR) << "Built-in generator " << output.name
                        << " specifies a maximum edition "
                        << output.generator->GetMaximumEdition()
                        << " which is not the protoc maximum "
                        << ProtocMaximumEdition() << ".";
        return false;
      }
    }
    for (const FieldDescriptor* ext :
         output.generator->GetFeatureExtensions()) {
      if (ext == nullptr) {
        ABSL_LOG(ERROR) << "Built-in generator " << output.name
                        << " specifies an unknown feature extension.";
        return false;
      }
      feature_extensions.push_back(ext);
    }
  }
  absl::StatusOr<FeatureSetDefaults> defaults =
      FeatureResolver::CompileDefaults(
          FeatureSet::descriptor(), feature_extensions, ProtocMinimumEdition(),
          MaximumKnownEdition());
  if (!defaults.ok()) {
    ABSL_LOG(ERROR) << defaults.status();
    return false;
  }
  absl::Status status = pool.SetFeatureSetDefaults(std::move(defaults).value());
  ABSL_CHECK(status.ok()) << status.message();
  return true;
}